

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

void set_destroy(set s)

{
  long lVar1;
  void *in_RDI;
  bucket b;
  size_t iterator;
  undefined8 local_10;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      for (local_10 = 0; local_10 < *(ulong *)((long)in_RDI + 8); local_10 = local_10 + 1) {
        lVar1 = *(long *)((long)in_RDI + 0x18) + local_10 * 0x18;
        if (*(long *)(lVar1 + 0x10) != 0) {
          free(*(void **)(lVar1 + 0x10));
        }
      }
      free(*(void **)((long)in_RDI + 0x18));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void set_destroy(set s)
{
	if (s == NULL)
	{
		return;
	}

	if (s->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < s->capacity; ++iterator)
		{
			bucket b = &s->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(s->buckets);
	}

	free(s);
}